

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O3

bool __thiscall
jsoncons::typed_array_visitor<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>::
visit_typed_array(typed_array_visitor<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  *this,span<const_unsigned_short,_18446744073709551615UL> *data,
                 semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar1;
  pointer puVar2;
  pointer puVar3;
  allocator_type local_29;
  pointer local_28;
  pointer puStack_20;
  pointer local_18;
  
  std::vector<unsigned_short,std::allocator<unsigned_short>>::vector<unsigned_short_const*,void>
            ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_28,data->data_,
             data->data_ + data->size_,&local_29);
  pvVar1 = this->v_;
  puVar2 = (pvVar1->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (pvVar1->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (pvVar1->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_start = local_28;
  (pvVar1->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_finish = puStack_20;
  (pvVar1->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_18;
  local_28 = (pointer)0x0;
  puStack_20 = (pointer)0x0;
  local_18 = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)puVar3 - (long)puVar2);
    if (local_28 != (pointer)0x0) {
      operator_delete(local_28,(long)local_18 - (long)local_28);
    }
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const value_type>& data,  
            semantic_tag,
            const ser_context&,
            std::error_code&) override
        {
            v_ = std::vector<value_type>(data.begin(),data.end());
            JSONCONS_VISITOR_RETURN;
        }